

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmGhsMultiTargetGenerator::WriteSources(cmGhsMultiTargetGenerator *this,ostream *fout_proj)

{
  Types TVar1;
  cmMakefile *pcVar2;
  cmGeneratorTarget *this_00;
  cmSourceFile *this_01;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  computeInternalDepfile;
  pointer ppcVar3;
  bool bVar4;
  __type _Var5;
  string *psVar6;
  cmSourceGroup *this_02;
  mapped_type *pmVar7;
  iterator iVar8;
  _Base_ptr p_Var9;
  ulong uVar10;
  ostream *poVar11;
  cmCustomCommand *pcVar12;
  cmGeneratedFileStream *this_03;
  cmSourceFileLocation *pcVar13;
  cmSourceFile *sourceFile;
  pointer ppcVar14;
  long lVar15;
  key_type *__k;
  pointer ppcVar16;
  int iVar17;
  pointer ppcVar18;
  cmGhsMultiTargetGenerator *pcVar19;
  cmGhsMultiTargetGenerator *this_04;
  pointer ppcVar20;
  string *gn_1;
  pointer pbVar21;
  pointer ppcVar22;
  pointer ppcVar23;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  undefined8 uVar24;
  unkbyte9 in_stack_fffffffffffff9e8;
  char in_stack_fffffffffffff9f1;
  char in_stack_fffffffffffff9f2;
  char in_stack_fffffffffffff9f3;
  int in_stack_fffffffffffff9f4;
  cmGeneratedFileStream *local_608;
  string fpath;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> customCommands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groupFilesList;
  cmGeneratedFileStream *f;
  pointer local_588;
  cmGhsMultiTargetGenerator *local_580;
  _Base_ptr local_578;
  _Base_ptr local_570;
  vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_> gfiles;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groupNames;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  standardGroups;
  string local_4d0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
  groupFiles;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> sourceGroups;
  _Any_data local_468;
  undefined8 local_458;
  undefined8 uStack_450;
  string local_440;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_420;
  cmSourceFile *sf;
  _Alloc_hider local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8 [21];
  string gn;
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [456];
  
  sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  cmGeneratorTarget::GetSourceFiles(this->GeneratorTarget,&sources,&this->ConfigName);
  local_580 = this;
  std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector
            (&sourceGroups,&this->Makefile->SourceGroups);
  ppcVar23 = sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  groupFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &groupFiles._M_t._M_impl.super__Rb_tree_header._M_header;
  groupFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  groupFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  groupFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  groupNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &groupNames._M_t._M_impl.super__Rb_tree_header._M_header;
  groupNames._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  groupNames._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  groupNames._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  groupNames._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       groupNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  groupFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       groupFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (ppcVar14 = sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppcVar14 != ppcVar23;
      ppcVar14 = ppcVar14 + 1) {
    sf = *ppcVar14;
    pcVar2 = local_580->Makefile;
    psVar6 = cmSourceFile::ResolveFullPath(sf,(string *)0x0,(string *)0x0);
    this_02 = cmMakefile::FindSourceGroup(pcVar2,psVar6,&sourceGroups);
    psVar6 = cmSourceGroup::GetFullName_abi_cxx11_(this_02);
    std::__cxx11::string::string((string *)&gn,(string *)psVar6);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
             ::operator[](&groupFiles,&gn);
    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back(pmVar7,&sf);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&groupNames,&gn);
    std::__cxx11::string::~string((string *)&gn);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gn,"CMake Rules",(allocator<char> *)&sf);
  std::__cxx11::string::string<std::allocator<char>>
            (local_278,"Header Files",(allocator<char> *)&fpath);
  this_04 = local_580;
  std::__cxx11::string::string<std::allocator<char>>(local_258,"Source Files",(allocator<char> *)&f)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            (local_238,"Object Files",(allocator<char> *)&local_4d0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_218,"Object Libraries",(allocator<char> *)&groupFilesList);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1f8,"Resources",(allocator<char> *)&gfiles);
  __l._M_len = 6;
  __l._M_array = &gn;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&standardGroups,__l,(allocator_type *)&customCommands);
  lVar15 = 0xa0;
  do {
    std::__cxx11::string::~string(local_278 + lVar15 + -0x20);
    lVar15 = lVar15 + -0x20;
  } while (lVar15 != -0x20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&groupFilesList,groupFiles._M_t._M_impl.super__Rb_tree_header._M_node_count,
           (allocator_type *)&gn);
  iVar17 = 0;
  for (pbVar21 = standardGroups.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; lVar15 = (long)iVar17,
      pbVar21 !=
      standardGroups.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; pbVar21 = pbVar21 + 1) {
    iVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&groupNames._M_t,pbVar21);
    if ((_Rb_tree_header *)iVar8._M_node == &groupNames._M_t._M_impl.super__Rb_tree_header) {
      if ((this_04->TagType == CUSTOM_TARGET) &&
         (bVar4 = std::operator==(pbVar21,"CMake Rules"), bVar4)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize(&groupFilesList,
                 ((long)groupFilesList.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)groupFilesList.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
        std::__cxx11::string::_M_assign
                  ((string *)
                   (groupFilesList.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar15));
        goto LAB_0045aa7b;
      }
    }
    else {
      std::__cxx11::string::_M_assign
                ((string *)
                 (groupFilesList.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar15));
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase(&groupNames._M_t,pbVar21);
LAB_0045aa7b:
      iVar17 = iVar17 + 1;
    }
  }
  gn._M_dataplus._M_p = (pointer)&gn.field_2;
  gn._M_string_length = 0;
  gn.field_2._M_local_buf[0] = '\0';
  iVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&groupNames._M_t,&gn);
  if ((_Rb_tree_header *)iVar8._M_node != &groupNames._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::_M_assign
              ((string *)
               (groupFilesList.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1));
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(&groupNames._M_t,&gn);
  }
  std::__cxx11::string::~string((string *)&gn);
  lVar15 = lVar15 << 5;
  p_Var9 = groupNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (pbVar21 = groupFilesList.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
        __k = groupFilesList.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start,
        (_Rb_tree_header *)p_Var9 != &groupNames._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::_M_assign
              ((string *)
               ((long)&((groupFilesList.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar15));
    p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    lVar15 = lVar15 + 0x20;
  }
  for (; __k != pbVar21; __k = __k + 1) {
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
             ::operator[](&groupFiles,__k);
    ppcVar23 = (pmVar7->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>)._M_impl
               .super__Vector_impl_data._M_start;
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
             ::operator[](&groupFiles,__k);
    ppcVar14 = (pmVar7->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>)._M_impl
               .super__Vector_impl_data._M_finish;
    if (ppcVar23 != ppcVar14) {
      uVar10 = (long)ppcVar14 - (long)ppcVar23 >> 3;
      lVar15 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar15 == 0; lVar15 = lVar15 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<cmGhsMultiTargetGenerator::WriteSources(std::ostream&)::__0>>
                (ppcVar23,ppcVar14,((uint)lVar15 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)ppcVar14 - (long)ppcVar23 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmGhsMultiTargetGenerator::WriteSources(std::ostream&)::__0>>
                  (ppcVar23,ppcVar14);
      }
      else {
        ppcVar22 = ppcVar23 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmGhsMultiTargetGenerator::WriteSources(std::ostream&)::__0>>
                  (ppcVar23,ppcVar22);
        for (; ppcVar22 != ppcVar14; ppcVar22 = ppcVar22 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,__gnu_cxx::__ops::_Val_comp_iter<cmGhsMultiTargetGenerator::WriteSources(std::ostream&)::__0>>
                    (ppcVar22);
        }
      }
    }
  }
  gfiles.super__Vector_base<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  gfiles.super__Vector_base<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  gfiles.super__Vector_base<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_570 = (_Base_ptr)&this_04->Name;
  p_Var9 = (_Base_ptr)
           groupFilesList.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    ppcVar3 = gfiles.
              super__Vector_base<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppcVar16 = gfiles.
               super__Vector_base<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (p_Var9 == (_Base_ptr)
                  groupFilesList.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      for (; ppcVar16 != ppcVar3; ppcVar16 = ppcVar16 + 1) {
        cmGeneratedFileStream::Close(*ppcVar16);
      }
      std::_Vector_base<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>::
      ~_Vector_base(&gfiles.
                     super__Vector_base<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>
                   );
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&groupFilesList);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&standardGroups);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&groupNames._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
      ::~_Rb_tree(&groupFiles._M_t);
      std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::~vector(&sourceGroups);
      std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
                (&sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
      return;
    }
    this_00 = this_04->GeneratorTarget;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gn,"GHS_NO_SOURCE_GROUP_FILE",(allocator<char> *)&f);
    fpath._M_dataplus._M_p = (pointer)cmGeneratorTarget::GetProperty(this_00,&gn);
    bVar4 = cmValue::IsOn((cmValue *)&fpath);
    local_608 = (cmGeneratedFileStream *)fout_proj;
    local_578 = p_Var9;
    if (bVar4) {
      std::__cxx11::string::~string((string *)&gn);
LAB_0045ad0b:
      if (p_Var9->_M_parent == (_Base_ptr)0x0) {
        poVar11 = std::operator<<(fout_proj,"{comment} Others");
      }
      else {
        poVar11 = std::operator<<(fout_proj,"{comment} ");
        poVar11 = std::operator<<(poVar11,(string *)p_Var9);
      }
      std::operator<<(poVar11,'\n');
    }
    else {
      pcVar2 = this_04->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sf,"CMAKE_GHS_NO_SOURCE_GROUP_FILE",(allocator<char> *)&customCommands);
      bVar4 = cmMakefile::IsOn(pcVar2,(string *)&sf);
      std::__cxx11::string::~string((string *)&sf);
      std::__cxx11::string::~string((string *)&gn);
      p_Var9 = local_578;
      if (bVar4) goto LAB_0045ad0b;
      if (local_578->_M_parent == (_Base_ptr)0x0) {
LAB_0045b21c:
        std::operator<<((ostream *)local_608,"{comment} Others\n");
      }
      else {
        std::__cxx11::string::string((string *)&gn,(string *)local_578);
        cmsys::SystemTools::ReplaceString(&gn,"\\","_");
        cmStrCat<std::__cxx11::string&,char_const*&>
                  ((string *)&sf,&gn,&cmGlobalGhsMultiGenerator::FILE_EXTENSION);
        psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                           (&this_04->LocalGenerator->super_cmLocalGenerator);
        customCommands.
        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT71(customCommands.
                               super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,0x2f);
        (*(this_04->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter.
          _vptr_cmOutputConverter[0x10])
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                   this_04->LocalGenerator,this_04->GeneratorTarget);
        in_stack_fffffffffffff9f4 = CONCAT31((int3)((uint)in_stack_fffffffffffff9f4 >> 8),0x2f);
        cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string,char,std::__cxx11::string&>
                  (&fpath,psVar6,(char *)&customCommands,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                   &stack0xfffffffffffff9f4,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sf);
        std::__cxx11::string::~string((string *)&f);
        this_03 = (cmGeneratedFileStream *)operator_new(0x268);
        cmGeneratedFileStream::cmGeneratedFileStream(this_03,&fpath,false,None);
        f = this_03;
        cmGeneratedFileStream::SetCopyIfDifferent(this_03,true);
        std::vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>::push_back
                  (&gfiles,&f);
        local_608 = f;
        cmGlobalGhsMultiGenerator::WriteFileHeader
                  ((cmGlobalGhsMultiGenerator *)
                   (this_04->LocalGenerator->super_cmLocalGenerator).GlobalGenerator,(ostream *)f);
        GhsMultiGpj::WriteGpjTag(SUBPROJECT,(ostream *)f);
        poVar11 = std::operator<<(fout_proj,(string *)&sf);
        std::operator<<(poVar11," ");
        GhsMultiGpj::WriteGpjTag(SUBPROJECT,fout_proj);
        std::__cxx11::string::~string((string *)&fpath);
        std::__cxx11::string::~string((string *)&sf);
        std::__cxx11::string::~string((string *)&gn);
        if (p_Var9->_M_parent == (_Base_ptr)0x0) goto LAB_0045b21c;
      }
    }
    bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            p_Var9,"CMake Rules");
    if (bVar4) {
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
               ::operator[](&groupFiles,(key_type *)p_Var9);
      local_588 = (pmVar7->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
      for (ppcVar23 = (pmVar7->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>).
                      _M_impl.super__Vector_impl_data._M_start; ppcVar23 != local_588;
          ppcVar23 = ppcVar23 + 1) {
        this_01 = *ppcVar23;
        psVar6 = cmSourceFile::GetFullPath_abi_cxx11_(this_01);
        std::__cxx11::string::string((string *)&gn,(string *)psVar6);
        cmSystemTools::ConvertToOutputSlashes(&gn);
        sf = (cmSourceFile *)local_3e8;
        local_3f0._M_p = (pointer)0x0;
        local_3e8[0]._M_local_buf[0] = '\0';
        TVar1 = this_04->TagType;
        if ((TVar1 == CUSTOM_TARGET) &&
           (cmSourceFile::GetLanguage_abi_cxx11_(&local_4d0,this_01),
           local_4d0._M_string_length != 0)) {
          std::__cxx11::string::~string((string *)&local_4d0);
LAB_0045ae3c:
          bVar4 = true;
          std::__cxx11::string::assign((char *)&sf);
        }
        else {
          pcVar12 = cmSourceFile::GetCustomCommand(this_01);
          if (TVar1 == CUSTOM_TARGET) {
            std::__cxx11::string::~string((string *)&local_4d0);
          }
          if (pcVar12 != (cmCustomCommand *)0x0) goto LAB_0045ae3c;
          bVar4 = false;
        }
        poVar11 = std::operator<<((ostream *)local_608,(string *)&sf);
        poVar11 = std::operator<<(poVar11,(string *)&gn);
        WriteObjectLangOverride_abi_cxx11_(&fpath,(cmGhsMultiTargetGenerator *)this_01,sourceFile);
        poVar11 = std::operator<<(poVar11,(string *)&fpath);
        std::operator<<(poVar11,'\n');
        std::__cxx11::string::~string((string *)&fpath);
        this_04 = local_580;
        if (!bVar4) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&fpath,"INCLUDE_DIRECTORIES",(allocator<char> *)&customCommands);
          pcVar19 = (cmGhsMultiTargetGenerator *)&f;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&f,"-I",(allocator<char> *)&stack0xfffffffffffff9f4);
          WriteSourceProperty(pcVar19,(ostream *)local_608,this_01,&fpath,(string *)&f);
          std::__cxx11::string::~string((string *)&f);
          std::__cxx11::string::~string((string *)&fpath);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&fpath,"COMPILE_DEFINITIONS",(allocator<char> *)&customCommands);
          pcVar19 = (cmGhsMultiTargetGenerator *)&f;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&f,"-D",(allocator<char> *)&stack0xfffffffffffff9f4);
          WriteSourceProperty(pcVar19,(ostream *)local_608,this_01,&fpath,(string *)&f);
          std::__cxx11::string::~string((string *)&f);
          std::__cxx11::string::~string((string *)&fpath);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&fpath,"COMPILE_OPTIONS",(allocator<char> *)&customCommands);
          pcVar19 = (cmGhsMultiTargetGenerator *)&f;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&f,"",(allocator<char> *)&stack0xfffffffffffff9f4);
          WriteSourceProperty(pcVar19,(ostream *)local_608,this_01,&fpath,(string *)&f);
          std::__cxx11::string::~string((string *)&f);
          std::__cxx11::string::~string((string *)&fpath);
          psVar6 = cmGeneratorTarget::GetObjectName_abi_cxx11_(this_04->GeneratorTarget,this_01);
          std::__cxx11::string::string((string *)&fpath,(string *)psVar6);
          if ((fpath._M_string_length != 0) &&
             (bVar4 = cmGeneratorTarget::HasExplicitObjectName(this_04->GeneratorTarget,this_01),
             bVar4)) {
            poVar11 = std::operator<<((ostream *)local_608,"    -o ");
            poVar11 = std::operator<<(poVar11,(string *)&fpath);
            std::operator<<(poVar11,'\n');
          }
          std::__cxx11::string::~string((string *)&fpath);
        }
        std::__cxx11::string::~string((string *)&sf);
        std::__cxx11::string::~string((string *)&gn);
      }
    }
    else {
      customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar4 = ComputeCustomCommandOrder(this_04,&customCommands);
      ppcVar20 = customCommands.
                 super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (bVar4) {
        psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this_04->GeneratorTarget);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sf,
                       "The custom commands for target [",psVar6);
        std::operator+(&gn,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sf,
                       "] had a cycle.\n");
        std::__cxx11::string::~string((string *)&sf);
        cmSystemTools::Error(&gn);
        std::__cxx11::string::~string((string *)&gn);
      }
      else {
        do {
          ppcVar18 = ppcVar20;
          if (ppcVar18 ==
              customCommands.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) goto LAB_0045b29d;
          pcVar13 = cmSourceFile::GetLocation(*ppcVar18);
          std::operator+(&gn,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_570,".rule");
          _Var5 = std::operator==(&pcVar13->Name,&gn);
          std::__cxx11::string::~string((string *)&gn);
          ppcVar20 = ppcVar18 + 1;
        } while (!_Var5);
        std::_V2::
        __rotate<__gnu_cxx::__normal_iterator<cmSourceFile_const**,std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>>
                  (ppcVar18,ppcVar18 + 1,
                   customCommands.
                   super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
LAB_0045b29d:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&fpath,".sh",(allocator<char> *)&gn);
        local_588 = customCommands.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        iVar17 = 0;
        for (ppcVar20 = customCommands.
                        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppcVar20 != local_588;
            ppcVar20 = ppcVar20 + 1) {
          pcVar12 = cmSourceFile::GetCustomCommand(*ppcVar20);
          uVar24 = 0x45b2ee;
          std::__cxx11::string::string((string *)&local_440,(string *)&this->ConfigName);
          local_420._M_engaged = false;
          local_468._M_unused._M_object = (void *)0x0;
          local_468._8_8_ = 0;
          local_458 = 0;
          uStack_450 = 0;
          computeInternalDepfile.super__Function_base._M_functor._8_8_ = uVar24;
          computeInternalDepfile.super__Function_base._M_functor._M_unused._M_object = &local_468;
          computeInternalDepfile._16_9_ = in_stack_fffffffffffff9e8;
          computeInternalDepfile._M_invoker._1_1_ = in_stack_fffffffffffff9f1;
          computeInternalDepfile._M_invoker._2_1_ = in_stack_fffffffffffff9f2;
          computeInternalDepfile._M_invoker._3_1_ = in_stack_fffffffffffff9f3;
          computeInternalDepfile._M_invoker._4_4_ = in_stack_fffffffffffff9f4;
          cmCustomCommandGenerator::cmCustomCommandGenerator
                    ((cmCustomCommandGenerator *)&sf,pcVar12,&local_440,
                     &this_04->LocalGenerator->super_cmLocalGenerator,true,
                     (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_420,computeInternalDepfile);
          std::_Function_base::~_Function_base((_Function_base *)&local_468);
          std::
          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_M_reset(&local_420);
          std::__cxx11::string::~string((string *)&local_440);
          psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                             (&this_04->LocalGenerator->super_cmLocalGenerator);
          in_stack_fffffffffffff9f3 = '/';
          (*(this_04->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter.
            _vptr_cmOutputConverter[0x10])(&gn,this_04->LocalGenerator,this_04->GeneratorTarget);
          in_stack_fffffffffffff9f2 = '/';
          in_stack_fffffffffffff9f1 = '_';
          in_stack_fffffffffffff9f4 = iVar17;
          pcVar13 = cmSourceFile::GetLocation(*ppcVar20);
          cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string,char,std::__cxx11::string_const&,char_const(&)[4],int,char,std::__cxx11::string_const&,std::__cxx11::string&>
                    ((string *)&f,psVar6,&stack0xfffffffffffff9f3,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gn,
                     &stack0xfffffffffffff9f2,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_570,
                     (char (*) [4])"_cc",(int *)&stack0xfffffffffffff9f4,&stack0xfffffffffffff9f1,
                     &pcVar13->Name,&fpath);
          std::__cxx11::string::~string((string *)&gn);
          cmGeneratedFileStream::cmGeneratedFileStream
                    ((cmGeneratedFileStream *)&gn,(string *)&f,false,None);
          cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)&gn,true);
          WriteCustomCommandsHelper(this_04,(ostream *)&gn,(cmCustomCommandGenerator *)&sf);
          pcVar19 = (cmGhsMultiTargetGenerator *)&gn;
          cmGeneratedFileStream::Close((cmGeneratedFileStream *)&gn);
          WriteCustomCommandLine
                    (pcVar19,(ostream *)local_608,(string *)&f,(cmCustomCommandGenerator *)&sf);
          cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&gn);
          std::__cxx11::string::~string((string *)&f);
          cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)&sf);
          iVar17 = iVar17 + 1;
        }
        std::__cxx11::string::~string((string *)&fpath);
      }
      if (this_04->TagType == CUSTOM_TARGET) {
        WriteBuildEvents(this_04,(ostream *)local_608);
      }
      std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
                (&customCommands.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>);
    }
    p_Var9 = local_578 + 1;
  } while( true );
}

Assistant:

void cmGhsMultiTargetGenerator::WriteSources(std::ostream& fout_proj)
{
  /* vector of all sources for this target */
  std::vector<cmSourceFile*> sources;
  this->GeneratorTarget->GetSourceFiles(sources, this->ConfigName);

  /* vector of all groups defined for this target
   * -- but the vector is not expanded with sub groups or in any useful order
   */
  std::vector<cmSourceGroup> sourceGroups = this->Makefile->GetSourceGroups();

  /* for each source file assign it to its group */
  std::map<std::string, std::vector<cmSourceFile*>> groupFiles;
  std::set<std::string> groupNames;
  for (cmSourceFile* sf : sources) {
    cmSourceGroup* sourceGroup =
      this->Makefile->FindSourceGroup(sf->ResolveFullPath(), sourceGroups);
    std::string gn = sourceGroup->GetFullName();
    groupFiles[gn].push_back(sf);
    groupNames.insert(std::move(gn));
  }

  /* list of known groups and the order they are displayed in a project file */
  const std::vector<std::string> standardGroups = {
    "CMake Rules",  "Header Files",     "Source Files",
    "Object Files", "Object Libraries", "Resources"
  };

  /* list of groups in the order they are displayed in a project file*/
  std::vector<std::string> groupFilesList(groupFiles.size());

  /* put the groups in the order they should be listed
   * - standard groups first, and then everything else
   *   in the order used by std::map.
   */
  int i = 0;
  for (const std::string& gn : standardGroups) {
    auto n = groupNames.find(gn);
    if (n != groupNames.end()) {
      groupFilesList[i] = *n;
      i += 1;
      groupNames.erase(gn);
    } else if (this->TagType == GhsMultiGpj::CUSTOM_TARGET &&
               gn == "CMake Rules") {
      /* make sure that rules folder always exists in case of custom targets
       * that have no custom commands except for pre or post build events.
       */
      groupFilesList.resize(groupFilesList.size() + 1);
      groupFilesList[i] = gn;
      i += 1;
    }
  }

  { /* catch-all group - is last item */
    std::string gn;
    auto n = groupNames.find(gn);
    if (n != groupNames.end()) {
      groupFilesList.back() = *n;
      groupNames.erase(gn);
    }
  }

  for (const auto& n : groupNames) {
    groupFilesList[i] = n;
    i += 1;
  }

  /* sort the files within each group */
  for (auto& n : groupFilesList) {
    std::sort(groupFiles[n].begin(), groupFiles[n].end(),
              [](cmSourceFile* l, cmSourceFile* r) {
                return l->ResolveFullPath() < r->ResolveFullPath();
              });
  }

  /* list of open project files */
  std::vector<cmGeneratedFileStream*> gfiles;

  /* write files into the proper project file
   * -- groups go into main project file
   *    unless NO_SOURCE_GROUP_FILE property or variable is set.
   */
  for (auto& sg : groupFilesList) {
    std::ostream* fout;
    bool useProjectFile =
      this->GeneratorTarget->GetProperty("GHS_NO_SOURCE_GROUP_FILE").IsOn() ||
      this->Makefile->IsOn("CMAKE_GHS_NO_SOURCE_GROUP_FILE");
    if (useProjectFile || sg.empty()) {
      fout = &fout_proj;
    } else {
      // Open the filestream in copy-if-different mode.
      std::string gname = sg;
      cmsys::SystemTools::ReplaceString(gname, "\\", "_");
      std::string lpath =
        cmStrCat(gname, cmGlobalGhsMultiGenerator::FILE_EXTENSION);
      std::string fpath = cmStrCat(
        this->LocalGenerator->GetCurrentBinaryDirectory(), '/',
        this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget), '/',
        lpath);
      cmGeneratedFileStream* f = new cmGeneratedFileStream(fpath);
      f->SetCopyIfDifferent(true);
      gfiles.push_back(f);
      fout = f;
      this->GetGlobalGenerator()->WriteFileHeader(*f);
      GhsMultiGpj::WriteGpjTag(GhsMultiGpj::SUBPROJECT, *f);
      fout_proj << lpath << " ";
      GhsMultiGpj::WriteGpjTag(GhsMultiGpj::SUBPROJECT, fout_proj);
    }

    if (useProjectFile) {
      if (sg.empty()) {
        *fout << "{comment} Others" << '\n';
      } else {
        *fout << "{comment} " << sg << '\n';
      }
    } else if (sg.empty()) {
      *fout << "{comment} Others\n";
    }

    if (sg != "CMake Rules") {
      /* output rule for each source file */
      for (const cmSourceFile* si : groupFiles[sg]) {
        bool compile = true;
        // Convert filename to native system
        // WORKAROUND: GHS MULTI 6.1.4 and 6.1.6 are known to need backslash on
        // windows when opening some files from the search window.
        std::string fname(si->GetFullPath());
        cmSystemTools::ConvertToOutputSlashes(fname);

        /* For custom targets list any associated sources,
         * comment out source code to prevent it from being
         * compiled when processing this target.
         * Otherwise, comment out any custom command (main) dependencies that
         * are listed as source files to prevent them from being considered
         * part of the build.
         */
        std::string comment;
        if ((this->TagType == GhsMultiGpj::CUSTOM_TARGET &&
             !si->GetLanguage().empty()) ||
            si->GetCustomCommand()) {
          comment = "{comment} ";
          compile = false;
        }

        *fout << comment << fname << WriteObjectLangOverride(si) << '\n';
        if (compile) {
          this->WriteSourceProperty(*fout, si, "INCLUDE_DIRECTORIES", "-I");
          this->WriteSourceProperty(*fout, si, "COMPILE_DEFINITIONS", "-D");
          this->WriteSourceProperty(*fout, si, "COMPILE_OPTIONS", "");

          /* to avoid clutter in the GUI only print out the objectName if it
           * has been renamed */
          std::string objectName = this->GeneratorTarget->GetObjectName(si);
          if (!objectName.empty() &&
              this->GeneratorTarget->HasExplicitObjectName(si)) {
            *fout << "    -o " << objectName << '\n';
          }
        }
      }
    } else {
      std::vector<cmSourceFile const*> customCommands;
      if (this->ComputeCustomCommandOrder(customCommands)) {
        std::string message = "The custom commands for target [" +
          this->GeneratorTarget->GetName() + "] had a cycle.\n";
        cmSystemTools::Error(message);
      } else {
        /* Custom targets do not have a dependency on SOURCES files.
         * Therefore the dependency list may include SOURCES files after the
         * custom target. Because nothing can depend on the custom target just
         * move it to the last item.
         */
        for (auto sf = customCommands.begin(); sf != customCommands.end();
             ++sf) {
          if (((*sf)->GetLocation()).GetName() == this->Name + ".rule") {
            std::rotate(sf, sf + 1, customCommands.end());
            break;
          }
        }
        int cmdcount = 0;
#ifdef _WIN32
        std::string fext = ".bat";
#else
        std::string fext = ".sh";
#endif
        for (auto& sf : customCommands) {
          const cmCustomCommand* cc = sf->GetCustomCommand();
          cmCustomCommandGenerator ccg(*cc, this->ConfigName,
                                       this->LocalGenerator);

          // Open the filestream for this custom command
          std::string fname = cmStrCat(
            this->LocalGenerator->GetCurrentBinaryDirectory(), '/',
            this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget),
            '/', this->Name, "_cc", cmdcount++, '_',
            (sf->GetLocation()).GetName(), fext);

          cmGeneratedFileStream f(fname);
          f.SetCopyIfDifferent(true);
          this->WriteCustomCommandsHelper(f, ccg);
          f.Close();
          this->WriteCustomCommandLine(*fout, fname, ccg);
        }
      }
      if (this->TagType == GhsMultiGpj::CUSTOM_TARGET) {
        this->WriteBuildEvents(*fout);
      }
    }
  }

  for (cmGeneratedFileStream* f : gfiles) {
    f->Close();
  }
}